

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

ssize_t kvtree_write_fd(char *file,int fd,kvtree *hash)

{
  char *pcVar1;
  ssize_t nwrite;
  size_t size;
  void *buf;
  kvtree *hash_local;
  char *pcStack_18;
  int fd_local;
  char *file_local;
  
  if (((file == (char *)0x0) || (fd < 0)) || (hash == (kvtree *)0x0)) {
    file_local = (char *)0xffffffffffffffff;
  }
  else {
    buf = hash;
    hash_local._4_4_ = fd;
    pcStack_18 = file;
    kvtree_write_persist((void **)&size,(size_t *)&nwrite,hash);
    pcVar1 = (char *)kvtree_write_attempt(pcStack_18,hash_local._4_4_,(void *)size,nwrite);
    kvtree_free(&size);
    file_local = pcVar1;
    if (pcVar1 != (char *)nwrite) {
      file_local = (char *)0xffffffffffffffff;
    }
  }
  return (ssize_t)file_local;
}

Assistant:

ssize_t kvtree_write_fd(const char* file, int fd, const kvtree* hash)
{
  /* check that we have a hash, a file name, and a file descriptor */
  if (file == NULL || fd < 0 || hash == NULL) {
    return -1;
  }

  /* persist hash to buffer */
  void* buf;
  size_t size;
  kvtree_write_persist(&buf, &size, hash);

  /* write buffer to file */
  ssize_t nwrite = kvtree_write_attempt(file, fd, buf, size);

  /* free the pack buffer */
  kvtree_free(&buf);

  /* if we didn't write all of the bytes, return an error */
  if (nwrite != size) {
    return -1;
  }

  return nwrite;
}